

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_node * fy_node_sequence_get_by_index(fy_node *fyn,int index)

{
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar1;
  fy_node *pfVar2;
  fy_node *pfVar3;
  int iVar4;
  
  if ((fyn == (fy_node *)0x0) || ((fyn->field_0x34 & 3) != 1)) {
    return (fy_node *)0x0;
  }
  paVar1 = &fyn->field_12;
  if (index < 0) {
    pfVar2 = (fy_node *)0x0;
    do {
      if (pfVar2 == (fy_node *)0x0) {
        if ((paVar1->sequence)._lh.next == (list_head *)paVar1) {
          pfVar2 = (fy_node *)0x0;
        }
        else {
          pfVar2 = (fy_node *)(fyn->field_12).sequence._lh.prev;
        }
      }
      else {
        pfVar3 = (fy_node *)(pfVar2->node).prev;
        pfVar2 = (fy_node *)0x0;
        if (pfVar3 != (fy_node *)paVar1) {
          pfVar2 = pfVar3;
        }
      }
      if (pfVar2 == (fy_node *)0x0) {
        return (fy_node *)0x0;
      }
      index = index + 1;
    } while (index != 0);
  }
  else {
    iVar4 = index + 1;
    pfVar3 = (fy_node *)0x0;
    do {
      if (pfVar3 == (fy_node *)0x0) {
        pfVar3 = (fy_node *)paVar1;
      }
      pfVar2 = (fy_node *)(pfVar3->node).next;
      pfVar3 = (fy_node *)0x0;
      if (pfVar2 != (fy_node *)paVar1) {
        pfVar3 = pfVar2;
      }
      pfVar2 = (fy_node *)0x0;
    } while ((pfVar3 != (fy_node *)0x0) && (iVar4 = iVar4 + -1, pfVar2 = pfVar3, 0 < iVar4));
  }
  return pfVar2;
}

Assistant:

struct fy_node *fy_node_sequence_get_by_index(struct fy_node *fyn, int index) {
    struct fy_node *fyni;
    void *iterp = NULL;

    if (!fyn || fyn->type != FYNT_SEQUENCE)
        return NULL;

    if (index >= 0) {
        do {
            fyni = fy_node_sequence_iterate(fyn, &iterp);
        } while (fyni && --index >= 0);
    } else {
        do {
            fyni = fy_node_sequence_reverse_iterate(fyn, &iterp);
        } while (fyni && ++index < 0);
    }

    return fyni;
}